

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

ssize_t __thiscall
anon_unknown.dwarf_2e169df::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  atomic<unsigned_int> *paVar1;
  function<void_(const_void_*,_const_dap::Error_*)> *__x;
  bool bVar2;
  ulong uVar3;
  size_t *__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>,_false,_false>,_bool>
  pVar4;
  int seq;
  Serializer s;
  __atomic_base<unsigned_int> local_80;
  __atomic_base<unsigned_int> local_7c;
  undefined1 local_78 [8];
  undefined1 auStack_70 [8];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  size_t local_38;
  undefined8 local_30;
  
  local_30 = CONCAT44(in_register_00000034,__fd);
  LOCK();
  paVar1 = &this->nextSeq;
  local_80._M_i = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  __x = (function<void_(const_void_*,_const_dap::Error_*)> *)CONCAT44(in_register_00000084,__flags);
  local_50._0_8_ = &(this->handlers).responseMutex;
  local_50[8] = false;
  local_7c._M_i = local_80._M_i;
  local_38 = __n;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
  local_50[8] = true;
  local_78 = (undefined1  [8])__buf;
  std::function<void_(const_void_*,_const_dap::Error_*)>::function
            ((function<void_(const_void_*,_const_dap::Error_*)> *)auStack_70,__x);
  pVar4 = std::
          _Hashtable<long,std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>,std::allocator<std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<int&,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>
                    ((_Hashtable<long,std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>,std::allocator<std::pair<long_const,std::pair<dap::TypeInfo_const*,std::function<void(void_const*,dap::Error_const*)>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&(this->handlers).responseMap,&local_80,local_78);
  if ((_Manager_type)local_68._8_8_ != (_Manager_type)0x0) {
    (*(code *)local_68._8_8_)
              ((function<void_(const_void_*,_const_dap::Error_*)> *)auStack_70,
               (function<void_(const_void_*,_const_dap::Error_*)> *)auStack_70,3);
  }
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    EventHandlers::errorfLocked
              (&this->handlers,"Response handler for sequence %d already registered",
               (ulong)local_80._M_i);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
  dap::json::JsonCppSerializer::JsonCppSerializer((JsonCppSerializer *)local_50);
  local_68._0_8_ = 0;
  local_68._8_8_ = (_Manager_type)0x0;
  local_78 = (undefined1  [8])0x0;
  auStack_70 = (undefined1  [8])0x0;
  local_78 = (undefined1  [8])operator_new(0x18);
  *(__atomic_base<unsigned_int> **)local_78 = &local_7c;
  *(undefined8 **)((long)local_78 + 8) = &local_30;
  __n_00 = &local_38;
  *(size_t **)((long)local_78 + 0x10) = __n_00;
  local_68._8_8_ =
       std::
       _Function_handler<bool_(dap::FieldSerializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/session.cpp:113:19)>
       ::_M_invoke;
  local_68._0_8_ =
       std::
       _Function_handler<bool_(dap::FieldSerializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/session.cpp:113:19)>
       ::_M_manager;
  bVar2 = dap::json::JsonCppSerializer::object
                    ((JsonCppSerializer *)local_50,
                     (function<bool_(dap::FieldSerializer_*)> *)local_78);
  if ((code *)local_68._0_8_ != (code *)0x0) {
    (*(code *)local_68._0_8_)(local_78,local_78,3);
  }
  if (bVar2) {
    dap::json::JsonCppSerializer::dump_abi_cxx11_((string *)local_78,(JsonCppSerializer *)local_50);
    uVar3 = send(this,(int)local_78,__buf_00,(size_t)__n_00,__flags);
    uVar3 = uVar3 & 0xffffffff;
    if (local_78 != (undefined1  [8])local_68) {
      operator_delete((void *)local_78,(ulong)(local_68._0_8_ + 1));
    }
  }
  else {
    uVar3 = 0;
  }
  dap::json::JsonCppSerializer::~JsonCppSerializer((JsonCppSerializer *)local_50);
  return uVar3;
}

Assistant:

bool send(const dap::TypeInfo* requestTypeInfo,
            const dap::TypeInfo* responseTypeInfo,
            const void* request,
            const GenericResponseHandler& responseHandler) override {
    int seq = nextSeq++;

    handlers.put(seq, responseTypeInfo, responseHandler);

    dap::json::Serializer s;
    if (!s.object([&](dap::FieldSerializer* fs) {
          return fs->field("seq", dap::integer(seq)) &&
                 fs->field("type", "request") &&
                 fs->field("command", requestTypeInfo->name()) &&
                 fs->field("arguments", [&](dap::Serializer* s) {
                   return requestTypeInfo->serialize(s, request);
                 });
        })) {
      return false;
    }
    return send(s.dump());
  }